

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_vdf.c
# Opt level: O2

void * VDF_openArchive(PHYSFS_Io *io,char *name,int forWriting,int *claimed)

{
  PHYSFS_ErrorCode errcode;
  int iVar1;
  uint uVar2;
  void *opaque;
  time_t ctime;
  void *pvVar3;
  PHYSFS_uint32 i;
  PHYSFS_uint32 PVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  PHYSFS_uint32 rootCatOffset;
  PHYSFS_uint32 version;
  PHYSFS_uint32 timestamp;
  PHYSFS_uint32 count;
  PHYSFS_uint32 type;
  PHYSFS_uint32 size;
  PHYSFS_uint32 jump;
  PHYSFS_uint32 dataSize;
  PHYSFS_uint32 local_ac;
  PHYSFS_uint8 sig [16];
  char name_1 [65];
  PHYSFS_uint8 ignore [16];
  
  if (io == (PHYSFS_Io *)0x0) {
    __assert_fail("io != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jarikomppa[P]physfs_magicstream/src/physfs_archiver_vdf.c"
                  ,0x68,"void *VDF_openArchive(PHYSFS_Io *, const char *, int, int *)");
  }
  if (forWriting == 0) {
    iVar1 = (*io->seek)(io,0x100);
    if (iVar1 == 0) {
      return (void *)0x0;
    }
    iVar1 = __PHYSFS_readAll(io,sig,0x10);
    if (iVar1 == 0) {
      return (void *)0x0;
    }
    auVar5[0] = -(sig[0] == 'P');
    auVar5[1] = -(sig[1] == 'S');
    auVar5[2] = -(sig[2] == 'V');
    auVar5[3] = -(sig[3] == 'D');
    auVar5[4] = -(sig[4] == 'S');
    auVar5[5] = -(sig[5] == 'C');
    auVar5[6] = -(sig[6] == '_');
    auVar5[7] = -(sig[7] == 'V');
    auVar5[8] = -(sig[8] == '2');
    auVar5[9] = -(sig[9] == '.');
    auVar5[10] = -(sig[10] == '0');
    auVar5[0xb] = -(sig[0xb] == '0');
    auVar5[0xc] = -(sig[0xc] == '\r');
    auVar5[0xd] = -(sig[0xd] == '\n');
    auVar5[0xe] = -(sig[0xe] == '\r');
    auVar5[0xf] = -(sig[0xf] == '\n');
    if (((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe | (ushort)(auVar5[0xf] >> 7) << 0xf)
         == 0xffff) ||
       (auVar6[0] = -(sig[0] == 'P'), auVar6[1] = -(sig[1] == 'S'), auVar6[2] = -(sig[2] == 'V'),
       auVar6[3] = -(sig[3] == 'D'), auVar6[4] = -(sig[4] == 'S'), auVar6[5] = -(sig[5] == 'C'),
       auVar6[6] = -(sig[6] == '_'), auVar6[7] = -(sig[7] == 'V'), auVar6[8] = -(sig[8] == '2'),
       auVar6[9] = -(sig[9] == '.'), auVar6[10] = -(sig[10] == '0'),
       auVar6[0xb] = -(sig[0xb] == '0'), auVar6[0xc] = -(sig[0xc] == '\n'),
       auVar6[0xd] = -(sig[0xd] == '\r'), auVar6[0xe] = -(sig[0xe] == '\n'),
       auVar6[0xf] = -(sig[0xf] == '\r'),
       (ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe | (ushort)(auVar6[0xf] >> 7) << 0xf)
       == 0xffff)) {
      *claimed = 1;
      iVar1 = readui32(io,&count);
      if (iVar1 == 0) {
        return (void *)0x0;
      }
      iVar1 = __PHYSFS_readAll(io,ignore,4);
      if (iVar1 == 0) {
        return (void *)0x0;
      }
      iVar1 = readui32(io,&timestamp);
      if (iVar1 == 0) {
        return (void *)0x0;
      }
      iVar1 = readui32(io,&dataSize);
      if (iVar1 == 0) {
        return (void *)0x0;
      }
      iVar1 = readui32(io,&rootCatOffset);
      if (iVar1 == 0) {
        return (void *)0x0;
      }
      iVar1 = readui32(io,&version);
      if (iVar1 == 0) {
        return (void *)0x0;
      }
      if (version == 0x50) {
        iVar1 = (*io->seek)(io,(PHYSFS_uint64)rootCatOffset);
        if (iVar1 == 0) {
          return (void *)0x0;
        }
        opaque = UNPK_openArchive(io);
        PVar4 = 0;
        if (opaque == (void *)0x0) {
          return (void *)0x0;
        }
        name_1[0x28] = '\0';
        name_1[0x29] = '\0';
        name_1[0x2a] = '\0';
        name_1[0x2b] = '\0';
        name_1[0x2c] = '\0';
        name_1[0x2d] = '\0';
        name_1[0x2e] = '\0';
        name_1[0x2f] = '\0';
        name_1[0x30] = '\0';
        name_1[0x31] = '\0';
        name_1[0x32] = '\0';
        name_1[0x33] = '\0';
        name_1[0x34] = '\0';
        name_1[0x35] = '\0';
        name_1[0x36] = '\0';
        name_1[0x37] = '\0';
        name_1[0x18] = '\0';
        name_1[0x19] = '\0';
        name_1[0x1a] = '\0';
        name_1[0x1b] = '\0';
        name_1[0x1c] = '\0';
        name_1[0x1d] = '\0';
        name_1[0x1e] = '\0';
        name_1[0x1f] = '\0';
        name_1[0x20] = '\0';
        name_1[0x21] = '\0';
        name_1[0x22] = '\0';
        name_1[0x23] = '\0';
        name_1[0x24] = '\0';
        name_1[0x25] = '\0';
        name_1[0x26] = '\0';
        name_1[0x27] = '\0';
        name_1._20_4_ = (timestamp >> 0x19) + 0x50;
        name_1._16_4_ = (timestamp >> 0x15 & 0xf) - 1;
        name_1._12_4_ = timestamp >> 0x10 & 0x1f;
        name_1._8_4_ = timestamp >> 0xb & 0x1f;
        name_1._4_4_ = timestamp >> 5 & 0x3f;
        name_1._0_4_ = timestamp * 2 & 0x3e;
        ctime = mktime((tm *)name_1);
        do {
          if (PVar4 == count) {
            return opaque;
          }
          iVar1 = __PHYSFS_readAll(io,(tm *)name_1,0x40);
          if ((((iVar1 == 0) || (iVar1 = readui32(io,&jump), iVar1 == 0)) ||
              (iVar1 = readui32(io,&size), iVar1 == 0)) ||
             ((iVar1 = readui32(io,&type), iVar1 == 0 ||
              (iVar1 = readui32(io,&local_ac), iVar1 == 0)))) {
LAB_001184ab:
            UNPK_abandonArchive(opaque);
            return (void *)0x0;
          }
          name_1[0x40] = '\0';
          for (uVar2 = 0x3f; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
            if (name_1[uVar2] < '\0') goto LAB_001184a3;
            if (name_1[uVar2] != ' ') break;
            name_1[uVar2] = '\0';
          }
          if (name_1[0] == '\0') {
LAB_001184a3:
            PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
            goto LAB_001184ab;
          }
          if ((-1 < (int)type) &&
             (pvVar3 = UNPK_addEntry(opaque,name_1,0,ctime,ctime,(ulong)jump,(ulong)size),
             pvVar3 == (void *)0x0)) goto LAB_001184ab;
          PVar4 = PVar4 + 1;
        } while( true );
      }
    }
    errcode = PHYSFS_ERR_UNSUPPORTED;
  }
  else {
    errcode = PHYSFS_ERR_READ_ONLY;
  }
  PHYSFS_setErrorCode(errcode);
  return (void *)0x0;
}

Assistant:

static void *VDF_openArchive(PHYSFS_Io *io, const char *name,
                             int forWriting, int *claimed)
{
    PHYSFS_uint8 ignore[16];
    PHYSFS_uint8 sig[VDF_SIGNATURE_LENGTH];
    PHYSFS_uint32 count, timestamp, version, dataSize, rootCatOffset;
    void *unpkarc;

    assert(io != NULL); /* shouldn't ever happen. */

    BAIL_IF(forWriting, PHYSFS_ERR_READ_ONLY, NULL);

    /* skip the 256-byte comment field. */
    BAIL_IF_ERRPASS(!io->seek(io, VDF_COMMENT_LENGTH), NULL);

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, sig, sizeof (sig)), NULL);

    if ((memcmp(sig, VDF_SIGNATURE_G1, VDF_SIGNATURE_LENGTH) != 0) &&
        (memcmp(sig, VDF_SIGNATURE_G2, VDF_SIGNATURE_LENGTH) != 0))
    {
        BAIL(PHYSFS_ERR_UNSUPPORTED, NULL);
    } /* if */

    *claimed = 1;

    BAIL_IF_ERRPASS(!readui32(io, &count), NULL);
    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 4), NULL);  /* numFiles */
    BAIL_IF_ERRPASS(!readui32(io, &timestamp), NULL);
    BAIL_IF_ERRPASS(!readui32(io, &dataSize), NULL);  /* dataSize */
    BAIL_IF_ERRPASS(!readui32(io, &rootCatOffset), NULL);  /* rootCatOff */
    BAIL_IF_ERRPASS(!readui32(io, &version), NULL);

    BAIL_IF(version != 0x50, PHYSFS_ERR_UNSUPPORTED, NULL);

    BAIL_IF_ERRPASS(!io->seek(io, rootCatOffset), NULL);

    unpkarc = UNPK_openArchive(io);
    BAIL_IF_ERRPASS(!unpkarc, NULL);

    if (!vdfLoadEntries(io, count, vdfDosTimeToEpoch(timestamp), unpkarc))
    {
        UNPK_abandonArchive(unpkarc);
        return NULL;
    } /* if */

    return unpkarc;
}